

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O0

void duckdb::BinaryExecutor::
     ExecuteConstant<int,int,int,duckdb::BinaryStandardOperatorWrapper,duckdb::MultiplyOperatorOverflowCheck,bool>
               (Vector *left,Vector *right,Vector *result,bool fun)

{
  bool bVar1;
  int iVar2;
  int *piVar3;
  int *piVar4;
  int *piVar5;
  undefined1 in_CL;
  Vector *in_RDX;
  Vector *in_RSI;
  bool in_stack_0000000f;
  int *result_data;
  int *rdata;
  int *ldata;
  undefined4 in_stack_ffffffffffffffb8;
  int iVar6;
  undefined4 in_stack_ffffffffffffffc4;
  uint uVar7;
  
  Vector::SetVectorType(in_RSI,(VectorType)((ulong)in_RDX >> 0x38));
  piVar3 = ConstantVector::GetData<int>((Vector *)0x1318354);
  piVar4 = ConstantVector::GetData<int>((Vector *)0x1318363);
  piVar5 = ConstantVector::GetData<int>((Vector *)0x1318372);
  bVar1 = ConstantVector::IsNull((Vector *)0x1318381);
  if ((!bVar1) && (bVar1 = ConstantVector::IsNull((Vector *)0x131838f), !bVar1)) {
    uVar7 = CONCAT13(in_CL,(int3)in_stack_ffffffffffffffc4) & 0x1ffffff;
    iVar2 = *piVar3;
    iVar6 = *piVar4;
    ConstantVector::Validity(in_RDX);
    iVar2 = BinaryStandardOperatorWrapper::
            Operation<bool,duckdb::MultiplyOperatorOverflowCheck,int,int,int>
                      (SUB81((ulong)piVar4 >> 0x38,0),(int)piVar4,(int)((ulong)piVar5 >> 0x20),
                       (ValidityMask *)CONCAT44(uVar7,iVar6),
                       CONCAT44(iVar2,in_stack_ffffffffffffffb8));
    *piVar5 = iVar2;
    return;
  }
  ConstantVector::SetNull((Vector *)result_data,in_stack_0000000f);
  return;
}

Assistant:

static void ExecuteConstant(Vector &left, Vector &right, Vector &result, FUNC fun) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);

		auto ldata = ConstantVector::GetData<LEFT_TYPE>(left);
		auto rdata = ConstantVector::GetData<RIGHT_TYPE>(right);
		auto result_data = ConstantVector::GetData<RESULT_TYPE>(result);

		if (ConstantVector::IsNull(left) || ConstantVector::IsNull(right)) {
			ConstantVector::SetNull(result, true);
			return;
		}
		*result_data = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
		    fun, *ldata, *rdata, ConstantVector::Validity(result), 0);
	}